

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

double __thiscall QPDFObjectHandle::getNumericValue(QPDFObjectHandle *this)

{
  bool bVar1;
  longlong lVar2;
  allocator<char> local_39;
  double local_38;
  string local_30;
  
  bVar1 = isInteger(this);
  if (bVar1) {
    lVar2 = getIntValue(this);
    local_38 = (double)lVar2;
  }
  else {
    bVar1 = isReal(this);
    if (bVar1) {
      getRealValue_abi_cxx11_(&local_30,this);
      local_38 = atof(local_30._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_30);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"returning 0",&local_39);
      typeWarning(this,"number",&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      local_38 = 0.0;
    }
  }
  return local_38;
}

Assistant:

double
QPDFObjectHandle::getNumericValue() const
{
    if (isInteger()) {
        return static_cast<double>(getIntValue());
    } else if (isReal()) {
        return atof(getRealValue().c_str());
    } else {
        typeWarning("number", "returning 0");
        QTC::TC("qpdf", "QPDFObjectHandle numeric non-numeric");
        return 0;
    }
}